

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

size_type __thiscall wabt::string_view::find_last_of(string_view *this,string_view s,size_type pos)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  size_type sVar4;
  
  uVar2 = this->size_ - 1;
  if (pos <= uVar2) {
    uVar2 = pos;
  }
  pcVar1 = this->data_;
  pcVar3 = pcVar1 + uVar2 + 1;
  do {
    if (pcVar3 == pcVar1) {
      return 0xffffffffffffffff;
    }
    if (s.size_ != 0) {
      sVar4 = 0;
      do {
        if (pcVar3[-1] == s.data_[sVar4]) {
          if (pcVar3 == pcVar1) {
            return 0xffffffffffffffff;
          }
          return (size_type)(pcVar3 + ~(ulong)pcVar1);
        }
        sVar4 = sVar4 + 1;
      } while (s.size_ != sVar4);
    }
    pcVar3 = pcVar3 + -1;
  } while( true );
}

Assistant:

string_view::size_type string_view::find_last_of(string_view s,
                                                 size_type pos) const noexcept {
  pos = std::min(pos, size_ - 1);
  reverse_iterator iter = std::find_first_of(
      reverse_iterator(begin() + (pos + 1)), rend(), s.begin(), s.end());
  return iter == rend() ? npos : (rend() - iter - 1);
}